

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

void __thiscall QtMWidgets::Section::Section(Section *this,Type t)

{
  this->type = t;
  this->zeroesAdded = false;
  this->sectionWidth = 0;
  (this->values).d.size = 0;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QString *)0x0;
  this->currentIndex = -1;
  this->offset = 0;
  return;
}

Assistant:

Section::Section( Type t )
	:	type( t )
	,	zeroesAdded( false )
	,	sectionWidth( 0 )
	,	currentIndex( -1 )
	,	offset( 0 )
{
}